

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_fader_process_pcm_frames
                    (ma_fader *pFader,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ma_format format;
  ulong frameCount_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __n;
  
  if (pFader == (ma_fader *)0x0) {
    return MA_INVALID_ARGS;
  }
  uVar4 = pFader->cursorInFrames;
  frameCount_00 = 0xffffffff - uVar4;
  if (uVar4 + frameCount >> 0x20 == 0) {
    frameCount_00 = frameCount;
  }
  fVar1 = pFader->volumeBeg;
  fVar2 = pFader->volumeEnd;
  if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
    uVar3 = pFader->lengthInFrames;
    format = (pFader->config).format;
    if (uVar4 < uVar3) {
      if (format != ma_format_f32) {
        return MA_NOT_IMPLEMENTED;
      }
      if (frameCount_00 != 0) {
        uVar5 = (ulong)(pFader->config).channels;
        uVar6 = 0;
        do {
          uVar7 = uVar6 + uVar4;
          if (uVar3 <= uVar6 + uVar4) {
            uVar7 = uVar3;
          }
          if (uVar5 != 0) {
            fVar1 = pFader->volumeBeg;
            fVar2 = pFader->volumeEnd;
            uVar8 = 0;
            do {
              *(float *)((long)pFramesOut + uVar8 * 4) =
                   *(float *)((long)pFramesIn + uVar8 * 4) *
                   ((fVar2 - fVar1) * ((float)(uVar7 & 0xffffffff) / (float)(uVar3 & 0xffffffff)) +
                   fVar1);
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
          uVar6 = uVar6 + 1;
          pFramesOut = (void *)((long)pFramesOut + uVar5 * 4);
          pFramesIn = (void *)((long)pFramesIn + uVar5 * 4);
        } while (uVar6 < frameCount_00);
      }
      goto LAB_0019f327;
    }
  }
  else {
    if ((fVar1 == 1.0) && (!NAN(fVar1))) {
      if (pFramesOut != pFramesIn) {
        for (uVar4 = ((&DAT_001bf4d0)[(pFader->config).format] * (pFader->config).channels) *
                     frameCount_00; uVar4 != 0; uVar4 = uVar4 - __n) {
          __n = 0xffffffff;
          if (uVar4 < 0xffffffff) {
            __n = uVar4;
          }
          memcpy(pFramesOut,pFramesIn,__n);
          pFramesOut = (void *)((long)pFramesOut + __n);
          pFramesIn = (void *)((long)pFramesIn + __n);
        }
      }
      goto LAB_0019f327;
    }
    format = (pFader->config).format;
  }
  ma_copy_and_apply_volume_and_clip_pcm_frames
            (pFramesOut,pFramesIn,frameCount_00,format,(pFader->config).channels,fVar2);
LAB_0019f327:
  pFader->cursorInFrames = pFader->cursorInFrames + frameCount_00;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_fader_process_pcm_frames(ma_fader* pFader, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pFader == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    For now we need to clamp frameCount so that the cursor never overflows 32-bits. This is required for
    the conversion to a float which we use for the linear interpolation. This might be changed later.
    */
    if (frameCount + pFader->cursorInFrames > UINT_MAX) {
        frameCount = UINT_MAX - pFader->cursorInFrames;
    }

    /* Optimized path if volumeBeg and volumeEnd are equal. */
    if (pFader->volumeBeg == pFader->volumeEnd) {
        if (pFader->volumeBeg == 1) {
            /* Straight copy. */
            ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels);
        } else {
            /* Copy with volume. */
            ma_copy_and_apply_volume_and_clip_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels, pFader->volumeEnd);
        }
    } else {
        /* Slower path. Volumes are different, so may need to do an interpolation. */
        if (pFader->cursorInFrames >= pFader->lengthInFrames) {
            /* Fast path. We've gone past the end of the fade period so just apply the end volume to all samples. */
            ma_copy_and_apply_volume_and_clip_pcm_frames(pFramesOut, pFramesIn, frameCount, pFader->config.format, pFader->config.channels, pFader->volumeEnd);
        } else {
            /* Slow path. This is where we do the actual fading. */
            ma_uint64 iFrame;
            ma_uint32 iChannel;

            /* For now we only support f32. Support for other formats will be added later. */
            if (pFader->config.format == ma_format_f32) {
                const float* pFramesInF32  = (const float*)pFramesIn;
                /* */ float* pFramesOutF32 = (      float*)pFramesOut;

                for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                    float a = (ma_uint32)ma_min(pFader->cursorInFrames + iFrame, pFader->lengthInFrames) / (float)((ma_uint32)pFader->lengthInFrames);   /* Safe cast due to the frameCount clamp at the top of this function. */
                    float volume = ma_mix_f32_fast(pFader->volumeBeg, pFader->volumeEnd, a);

                    for (iChannel = 0; iChannel < pFader->config.channels; iChannel += 1) {
                        pFramesOutF32[iFrame*pFader->config.channels + iChannel] = pFramesInF32[iFrame*pFader->config.channels + iChannel] * volume;
                    }
                }
            } else {
                return MA_NOT_IMPLEMENTED;
            }
        }
    }

    pFader->cursorInFrames += frameCount;

    return MA_SUCCESS;
}